

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void walk(object *base,object *top,object *array1,object *array2,int size)

{
  uint uVar1;
  int trueSize;
  int sz;
  int x;
  object *opnext;
  object *op;
  int size_local;
  object *array2_local;
  object *array1_local;
  object *top_local;
  object *base_local;
  
  opnext = base;
  while (opnext < top) {
    map(&opnext->class,array1,array2,size);
    uVar1 = (uint)(opnext->header >> 2) & 0x3fffffff;
    if ((opnext == array1) || (opnext == array2)) {
      _sz = (object *)((long)&opnext->header + (long)(int)((uVar1 + 2) * 8));
    }
    else if ((opnext->header & 2) == 0) {
      for (trueSize = 0; trueSize < (int)uVar1; trueSize = trueSize + 1) {
        map((object **)(&opnext[1].header + trueSize),array1,array2,size);
      }
      _sz = (object *)((long)&opnext->header + (long)(int)((uVar1 + 2) * 8));
    }
    else {
      _sz = (object *)((long)&opnext->header + (long)(int)(((uVar1 + 7) / 8 + 2) * 8));
    }
    opnext = _sz;
  }
  return;
}

Assistant:

static void walk(struct object *base, struct object *top,
                 struct object *array1, struct object *array2, int size)
{
    struct object *op, *opnext;
    int x, sz;

    for (op = base; op < top; op = opnext) {
        /*
         * Re-map the class pointer, in case that's the
         * object which has been remapped.
         */
        map(&op->class, array1, array2, size);

        /*
         * Skip our argument arrays, since otherwise things
         * get rather circular.
         */
        sz = SIZE(op);
        if ((op == array1) || (op == array2)) {
            opnext = WORDSUP(op, sz + 2);
            continue;
        }

        /*
         * Don't have to worry about instance variables
         * if it's a binary format.
         */
        if (IS_BINOBJ(op)) {
            int trueSize;

            /*
             * Skip size/class, and enough words to
             * contain the binary bytes.
             */
            trueSize = TO_WORDS(sz);
            opnext = WORDSUP(op, trueSize + 2);
            continue;
        }

        /*
         * For each instance variable slot, fix up the pointer
         * if needed.
         */
        for (x = 0; x < sz; ++x) {
            map(&op->data[x], array1, array2, size);
        }

        /*
         * Walk past this object
         */
        opnext = WORDSUP(op, sz + 2);
    }
}